

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManMarkDangling(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _Counter = Gia_ManObj(p,local_1c);
      bVar3 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_Counter = *(ulong *)_Counter & 0xffffffffbfffffff;
    iVar1 = Gia_ObjIsAnd(_Counter);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_Counter);
      if (iVar1 != 0) {
        pGVar2 = Gia_ObjFanin0(_Counter);
        *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(_Counter);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      pGVar2 = Gia_ObjFanin1(_Counter);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    }
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->nObjs) {
      _Counter = Gia_ManObj(p,local_1c);
      bVar3 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_Counter);
    if (iVar1 != 0) {
      local_20 = (uint)(((*(ulong *)_Counter >> 0x1e & 1) != 0 ^ 0xffU) & 1) + local_20;
    }
    local_1c = local_1c + 1;
  }
  return local_20;
}

Assistant:

int Gia_ManMarkDangling( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    Gia_ManForEachAnd( p, pObj, i )
        Counter += !pObj->fMark0;
    return Counter;
}